

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestPackFromSerializationExceedsSizeLimit_Test::
~AnyTest_TestPackFromSerializationExceedsSizeLimit_Test
          (AnyTest_TestPackFromSerializationExceedsSizeLimit_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnyTest, TestPackFromSerializationExceedsSizeLimit) {
  if (sizeof(size_t) == 4) {
    GTEST_SKIP() << "This toolchain can't allocate that much memory.";
  }
  proto2_unittest::TestAny submessage;
  submessage.mutable_text()->resize(INT_MAX, 'a');
  proto2_unittest::TestAny message;
  EXPECT_FALSE(message.mutable_any_value()->PackFrom(submessage));
}